

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22460c::BNTest_ShiftTestVectors_Test::TestBody
          (BNTest_ShiftTestVectors_Test *this)

{
  anon_class_8_1_8991fb9c local_38;
  function<void_(FileTest_*)> local_30;
  BNTest_ShiftTestVectors_Test *local_10;
  BNTest_ShiftTestVectors_Test *this_local;
  
  local_38.this = this;
  local_10 = this;
  std::function<void(FileTest*)>::
  function<(anonymous_namespace)::BNTest_ShiftTestVectors_Test::TestBody()::__0,void>
            ((function<void(FileTest*)> *)&local_30,&local_38);
  FileTestGTest("crypto/fipsmodule/bn/test/shift_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST_F(BNTest, ShiftTestVectors) {
  FileTestGTest("crypto/fipsmodule/bn/test/shift_tests.txt",
                [&](FileTest *t) { RunBNFileTest(t, ctx()); });
}